

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

size_t prt_terrain(wchar_t row,wchar_t col)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var1;
  wchar_t wVar2;
  feature *pfVar3;
  trap *ptVar4;
  char *str;
  uint8_t local_49;
  char local_48 [7];
  uint8_t attr;
  char buf [30];
  trap *trap;
  feature *feat;
  wchar_t col_local;
  wchar_t row_local;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  pfVar3 = square_feat((chunk *)cave,grid);
  grid_00.x = (player->grid).x;
  grid_00.y = (player->grid).y;
  ptVar4 = square_trap((chunk *)cave,grid_00);
  if (ptVar4 != (trap *)0x0) {
    grid_01.x = (player->grid).x;
    grid_01.y = (player->grid).y;
    _Var1 = square_isinvis((chunk *)cave,grid_01);
    if (!_Var1) {
      my_strcpy(local_48,ptVar4->kind->name,0x1e);
      local_49 = ptVar4->kind->d_attr;
      goto LAB_00214800;
    }
  }
  my_strcpy(local_48,pfVar3->name,0x1e);
  local_49 = pfVar3->d_attr;
LAB_00214800:
  my_strcap(local_48);
  str = format("%s ",local_48);
  c_put_str(local_49,str,row,col);
  wVar2 = longest_terrain_name();
  return (long)(wVar2 + L'\x01');
}

Assistant:

static size_t prt_terrain(int row, int col)
{
	struct feature *feat = square_feat(cave, player->grid);
	struct trap *trap = square_trap(cave, player->grid);
	char buf[30];
	uint8_t attr;

	if (trap && !square_isinvis(cave, player->grid)) {
		my_strcpy(buf, trap->kind->name, sizeof(buf));
		attr = trap->kind->d_attr;
	} else {
		my_strcpy(buf, feat->name, sizeof(buf));
		attr = feat->d_attr;
	}
	my_strcap(buf);
	c_put_str(attr, format("%s ", buf), row, col);

	return longest_terrain_name() + 1;
}